

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachment2
          (Impl *this,Value *value,VkAttachmentReference2 **out_reference)

{
  bool bVar1;
  uint uVar2;
  VkAttachmentReference2 *ref;
  Type pGVar3;
  
  ref = ScratchAllocator::allocate_cleared<VkAttachmentReference2>(&this->allocator);
  ref->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
  parse_attachment_base<VkAttachmentReference2>(ref,value);
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"aspectMask");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  ref->aspectMask = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"pNext");
  if (bVar1) {
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"pNext");
    bVar1 = parse_pnext_chain(this,pGVar3,&ref->pNext,(StateCreatorInterface *)0x0,
                              (DatabaseInterface *)0x0,(Value *)0x0);
    if (!bVar1) {
      return false;
    }
  }
  *out_reference = ref;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachment2(const Value &value, const VkAttachmentReference2 **out_reference)
{
	auto *ret = allocator.allocate_cleared<VkAttachmentReference2>();
	ret->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
	parse_attachment_base(*ret, value);
	ret->aspectMask = value["aspectMask"].GetUint();

	if (value.HasMember("pNext"))
		if (!parse_pnext_chain(value["pNext"], &ret->pNext))
			return false;

	*out_reference = ret;
	return true;
}